

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> * __thiscall
prometheus::Registry::Collect
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,Registry *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
  *collectable_4;
  pointer puVar6;
  unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
  *collectable;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_48;
  
  std::mutex::lock(&this->mutex_);
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->counters_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->counters_).
                super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    (*(((puVar7->_M_t).
        super___uniq_ptr_impl<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_prometheus::Family<prometheus::Counter>_*,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
        .super__Head_base<0UL,_prometheus::Family<prometheus::Counter>_*,_false>._M_head_impl)->
      super_Collectable)._vptr_Collectable[2])(&local_48);
    std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
              ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
  }
  puVar2 = (this->gauges_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->gauges_).
                super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    (*(((puVar8->_M_t).
        super___uniq_ptr_impl<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_prometheus::Family<prometheus::Gauge>_*,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
        .super__Head_base<0UL,_prometheus::Family<prometheus::Gauge>_*,_false>._M_head_impl)->
      super_Collectable)._vptr_Collectable[2])(&local_48);
    std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
              ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
  }
  puVar3 = (this->histograms_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->histograms_).
                super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1) {
    (*(((puVar9->_M_t).
        super___uniq_ptr_impl<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_prometheus::Family<prometheus::Histogram>_*,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
        .super__Head_base<0UL,_prometheus::Family<prometheus::Histogram>_*,_false>._M_head_impl)->
      super_Collectable)._vptr_Collectable[2])(&local_48);
    std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
              ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
  }
  puVar4 = (this->infos_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->infos_).
                 super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar4; puVar10 = puVar10 + 1
      ) {
    (*(((puVar10->_M_t).
        super___uniq_ptr_impl<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_prometheus::Family<prometheus::Info>_*,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
        .super__Head_base<0UL,_prometheus::Family<prometheus::Info>_*,_false>._M_head_impl)->
      super_Collectable)._vptr_Collectable[2])(&local_48);
    std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
              ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
  }
  puVar5 = (this->summaries_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->summaries_).
                super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar5; puVar6 = puVar6 + 1) {
    (*(((puVar6->_M_t).
        super___uniq_ptr_impl<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_prometheus::Family<prometheus::Summary>_*,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
        .super__Head_base<0UL,_prometheus::Family<prometheus::Summary>_*,_false>._M_head_impl)->
      super_Collectable)._vptr_Collectable[2])(&local_48);
    std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
              ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                )local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> Registry::Collect() const {
  std::lock_guard<std::mutex> lock{mutex_};
  auto results = std::vector<MetricFamily>{};

  CollectAll(results, counters_);
  CollectAll(results, gauges_);
  CollectAll(results, histograms_);
  CollectAll(results, infos_);
  CollectAll(results, summaries_);

  return results;
}